

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::BP32::decodeArray(BP32 *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint bit;
  uint32_t uVar2;
  uint32_t i;
  long lVar3;
  uint32_t *out_00;
  uint32_t *in_00;
  uint32_t Bs [4];
  uint local_48 [4];
  size_t *local_38;
  
  uVar1 = *in;
  in_00 = in + 1;
  local_38 = nvalue;
  out_00 = out;
  while (out_00 < out + uVar1) {
    local_48[0] = (uint)*(byte *)((long)in_00 + 3);
    local_48[1] = (uint)*(byte *)((long)in_00 + 2);
    local_48[2] = (uint)*(byte *)((long)in_00 + 1);
    uVar2 = *in_00;
    in_00 = in_00 + 1;
    local_48[3] = (uint)(byte)uVar2;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      bit = local_48[lVar3];
      fastunpack(in_00,out_00,bit);
      in_00 = in_00 + bit;
      out_00 = out_00 + 0x20;
    }
  }
  *local_38 = (long)out_00 - (long)out >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength;) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i, out += MiniBlockSize) {
        fastunpack(in, out, Bs[i]);
        in += Bs[i];
      }
    }
    nvalue = out - initout;
    return in;
  }